

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootindexproxymodel.cpp
# Opt level: O0

bool __thiscall
RootIndexProxyModel::insertColumns
          (RootIndexProxyModel *this,int column,int count,QModelIndex *parent)

{
  bool bVar1;
  byte bVar2;
  long lVar3;
  long *plVar4;
  QPersistentModelIndex local_78;
  QModelIndex local_70;
  undefined1 local_58 [24];
  QModelIndex sourceParent;
  RootIndexProxyModelPrivate *d;
  QModelIndex *parent_local;
  int count_local;
  int column_local;
  RootIndexProxyModel *this_local;
  
  lVar3 = QAbstractProxyModel::sourceModel();
  if (lVar3 == 0) {
    this_local._7_1_ = false;
  }
  else {
    sourceParent.m = (QAbstractItemModel *)d_func(this);
    QModelIndex::QModelIndex((QModelIndex *)(local_58 + 0x10));
    bVar1 = QModelIndex::isValid(parent);
    if (bVar1) {
      (**(code **)(*(long *)this + 400))(&local_70.m,this,parent);
      local_58._16_8_ = local_70.m;
      sourceParent.r = local_58._0_4_;
      sourceParent.c = local_58._4_4_;
      sourceParent.i = local_58._8_8_;
    }
    else {
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78);
      local_58._16_8_ = local_78.d;
      sourceParent.r = local_70.r;
      sourceParent.c = local_70.c;
      sourceParent.i = local_70.i;
    }
    plVar4 = (long *)QAbstractProxyModel::sourceModel();
    bVar2 = (**(code **)(*plVar4 + 0x100))(plVar4,column,count,local_58 + 0x10);
    this_local._7_1_ = (bool)(bVar2 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool RootIndexProxyModel::insertColumns(int column, int count, const QModelIndex &parent)
{
    Q_ASSERT(!parent.isValid() || parent.model() == this);
    if (!sourceModel())
        return 0;
    Q_D(RootIndexProxyModel);
    QModelIndex sourceParent;
    if (parent.isValid())
        sourceParent = mapToSource(parent);
    else
        sourceParent = d->m_rootIndex;
    return sourceModel()->insertColumns(column, count, sourceParent);
}